

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

unsigned_long
assembler::anon_unknown_0::_call_external<unsigned_long>(external_function *f,registers *regs)

{
  long lVar1;
  unsigned_long uVar2;
  fun_ptr_conflict20 fun_272;
  fun_ptr_conflict84 fun;
  fun_ptr_conflict4 fun_256;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> args;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> local_50;
  
  _get_arguments(&local_50,f);
  lVar1 = (long)local_50.
                super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.
                super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                ._M_impl.super__Vector_impl_data._M_start;
  switch(lVar1 >> 2) {
  case 0:
    uVar2 = (*(code *)f->address)();
    break;
  case 1:
    if (lVar1 != 4) {
      __assert_fail("args.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/asm/vm.cpp"
                    ,0x68b,
                    "T assembler::(anonymous namespace)::_call_external_1(const external_function &, std::vector<asmcode::operand> &, registers &) [T = unsigned long]"
                   );
    }
    uVar2 = (*(code *)(&DAT_00133854 + *(int *)(&DAT_00133854 + (ulong)**(uint **)&f->arguments * 4)
                      ))();
    return uVar2;
  case 2:
    if (lVar1 != 8) {
      __assert_fail("args.size() == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/asm/vm.cpp"
                    ,0x6df,
                    "T assembler::(anonymous namespace)::_call_external_2(const external_function &, std::vector<asmcode::operand> &, registers &) [T = unsigned long]"
                   );
    }
    uVar2 = (*(code *)(&DAT_001337f0 + *(int *)(&DAT_001337f0 + (ulong)**(uint **)&f->arguments * 4)
                      ))();
    return uVar2;
  case 3:
    if (lVar1 != 0xc) {
      __assert_fail("args.size() == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/asm/vm.cpp"
                    ,0x743,
                    "T assembler::(anonymous namespace)::_call_external_3(const external_function &, std::vector<asmcode::operand> &, registers &) [T = unsigned long]"
                   );
    }
    uVar2 = (*(code *)(&DAT_0013364c + *(int *)(&DAT_0013364c + (ulong)**(uint **)&f->arguments * 4)
                      ))();
    return uVar2;
  case 4:
    if (lVar1 != 0x10) {
      __assert_fail("args.size() == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/asm/vm.cpp"
                    ,0x792,
                    "T assembler::(anonymous namespace)::_call_external_4(const external_function &, std::vector<asmcode::operand> &, registers &) [T = unsigned long]"
                   );
    }
    uVar2 = (*(code *)(&DAT_00132fa8 + *(int *)(&DAT_00132fa8 + (ulong)**(uint **)&f->arguments * 4)
                      ))();
    return uVar2;
  default:
    uVar2 = 0;
  }
  if (local_50.
      super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

T _call_external(const external_function& f, registers& regs)
  {
      auto args = _get_arguments(f);
      switch (args.size())
      {
          case 0: return _call_external_0<T>(f);
          case 1: return _call_external_1<T>(f, args, regs);
          case 2: return _call_external_2<T>(f, args, regs);
          case 3: return _call_external_3<T>(f, args, regs);
          case 4: return _call_external_4<T>(f, args, regs);
          default: break;
      }
      return 0;
  }